

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::TypeOf(SQVM *this,SQObjectPtr *obj1,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQSharedState *ss;
  int iVar4;
  SQChar *s;
  SQString *pSVar5;
  SQMetaMethod mm;
  byte unaff_R12B;
  SQObjectPtr closure;
  SQObjectPtr local_38;
  
  if ((((obj1->super_SQObject)._type & 0x2000000) != 0) &&
     (pSVar3 = (obj1->super_SQObject)._unVal.pTable,
     (pSVar3->super_SQDelegable)._delegate != (SQTable *)0x0)) {
    local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_38.super_SQObject._type = OT_NULL;
    iVar4 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar3,this,8);
    if ((char)iVar4 != '\0') {
      Push(this,obj1);
      unaff_R12B = CallMetaMethod(this,&local_38,mm,1,dest);
    }
    SQObjectPtr::~SQObjectPtr(&local_38);
    if ((char)iVar4 != '\0') goto LAB_0012d5bd;
  }
  ss = this->_sharedstate;
  s = GetTypeName(obj1);
  pSVar5 = SQString::Create(ss,s,-1);
  pSVar3 = (dest->super_SQObject)._unVal.pTable;
  SVar2 = (dest->super_SQObject)._type;
  (dest->super_SQObject)._type = OT_STRING;
  (dest->super_SQObject)._unVal.pString = pSVar5;
  pSVar1 = &(pSVar5->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  unaff_R12B = 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
LAB_0012d5bd:
  return (bool)(unaff_R12B & 1);
}

Assistant:

bool SQVM::TypeOf(const SQObjectPtr &obj1,SQObjectPtr &dest)
{
    if(is_delegable(obj1) && _delegable(obj1)->_delegate) {
        SQObjectPtr closure;
        if(_delegable(obj1)->GetMetaMethod(this, MT_TYPEOF, closure)) {
            Push(obj1);
            return CallMetaMethod(closure,MT_TYPEOF,1,dest);
        }
    }
    dest = SQString::Create(_ss(this),GetTypeName(obj1));
    return true;
}